

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::EpsCopyInputStream::BackUp(EpsCopyInputStream *this,char *ptr)

{
  LogMessage *pLVar1;
  int local_58;
  int count;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  char *local_18;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_18 = ptr;
  ptr_local = (char *)this;
  if (ptr <= this->buffer_end_ + 0x10) {
    if (this->next_chunk_ == this->patch_buffer_) {
      local_58 = ((int)this->buffer_end_ + 0x10) - (int)ptr;
    }
    else {
      local_58 = this->size_ + ((int)this->buffer_end_ - (int)ptr);
    }
    if (0 < local_58) {
      StreamBackUp(this,local_58);
    }
    return;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"ptr <= buffer_end_ + kSlopBytes");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
             ,0x67,local_40._M_len,local_40._M_str);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

void BackUp(const char* ptr) {
    ABSL_DCHECK(ptr <= buffer_end_ + kSlopBytes);
    int count;
    if (next_chunk_ == patch_buffer_) {
      count = static_cast<int>(buffer_end_ + kSlopBytes - ptr);
    } else {
      count = size_ + static_cast<int>(buffer_end_ - ptr);
    }
    if (count > 0) StreamBackUp(count);
  }